

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O2

void fl_draw(char *str,int x,int y,int w,int h,Fl_Align align,Fl_Image *img,int draw_symbols)

{
  int iVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  
  if (str == (char *)0x0) {
    if (img == (Fl_Image *)0x0) {
      return;
    }
  }
  else if ((img == (Fl_Image *)0x0) && (*str == '\0')) {
    return;
  }
  uVar2 = CONCAT44(in_register_00000034,x);
  if (h != 0 && w != 0) {
    uVar2 = (ulong)(uint)x;
    iVar1 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2c])
                      (fl_graphics_driver,CONCAT44(in_register_00000034,x),(ulong)(uint)y,
                       (ulong)(uint)w,h);
    if (((align & 0x10) != 0) && (iVar1 == 0)) {
      return;
    }
  }
  if ((align & 0x40) == 0) {
    fl_draw(str,(int)uVar2,y,w,h,align,fl_draw,img,draw_symbols);
    return;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,uVar2,(ulong)(uint)y,(ulong)(uint)w,h);
  fl_draw(str,(int)uVar2,y,w,h,align,fl_draw,img,draw_symbols);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void fl_draw(
  const char* str,
  int x, int y, int w, int h,
  Fl_Align align,
  Fl_Image* img,
  int draw_symbols)
{
  if ((!str || !*str) && !img) return;
  if (w && h && !fl_not_clipped(x, y, w, h) && (align & FL_ALIGN_INSIDE)) return;
  if (align & FL_ALIGN_CLIP)
    fl_push_clip(x, y, w, h);
  fl_draw(str, x, y, w, h, align, fl_draw, img, draw_symbols);
  if (align & FL_ALIGN_CLIP)
    fl_pop_clip();
}